

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_rebuild(SAM_hdr *hdr)

{
  khint32_t kVar1;
  SAM_hdr_type *pSVar2;
  kh_sam_hdr_t *pkVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *__ptr;
  byte bVar8;
  uint uVar9;
  SAM_hdr_tag *pSVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  size_t __size;
  bool bVar16;
  SAM_hdr_type *local_50;
  ulong local_48;
  
  pkVar3 = hdr->h;
  uVar12 = pkVar3->n_buckets;
  if (uVar12 == 0) {
    uVar13 = 0;
  }
  else {
    uVar14 = uVar12 - 1 & 0x4844;
    iVar15 = 1;
    uVar11 = uVar14;
    do {
      bVar8 = (char)uVar11 * '\x02' & 0x1e;
      uVar9 = pkVar3->flags[uVar11 >> 4] >> bVar8;
      if (((uVar9 & 2) != 0) || (((uVar9 & 1) == 0 && (pkVar3->keys[uVar11] == 0x4844)))) {
        if ((pkVar3->flags[uVar11 >> 4] >> bVar8 & 3) != 0) {
          uVar11 = uVar12;
        }
        uVar13 = (ulong)uVar11;
        goto LAB_00134314;
      }
      uVar11 = uVar11 + iVar15 & uVar12 - 1;
      iVar15 = iVar15 + 1;
    } while (uVar11 != uVar14);
    uVar13 = (ulong)uVar12;
  }
LAB_00134314:
  __ptr = (char *)0x0;
  __size = 0;
  local_48 = 0;
  if ((uint)uVar13 == uVar12) {
LAB_00134330:
    pkVar3 = hdr->h;
    if (pkVar3->n_buckets != 0) {
      uVar13 = 0;
      do {
        iVar15 = 7;
        if (((pkVar3->flags[uVar13 >> 4] >> ((char)uVar13 * '\x02' & 0x1fU) & 3) == 0) &&
           (pkVar3->keys[uVar13] != 0x4844)) {
          pSVar2 = pkVar3->vals[uVar13];
          local_50 = pSVar2;
          do {
            pcVar5 = __ptr;
            if (__size < local_48 + 1) {
              uVar4 = local_48 >> 1 | local_48;
              uVar4 = uVar4 >> 2 | uVar4;
              uVar4 = uVar4 >> 4 | uVar4;
              uVar4 = uVar4 >> 8 | uVar4;
              __size = (uVar4 >> 0x10 | uVar4) + 1;
              pcVar5 = (char *)realloc(__ptr,__size);
              if (pcVar5 != (char *)0x0) goto LAB_001343e9;
              bVar16 = true;
            }
            else {
LAB_001343e9:
              __ptr = pcVar5;
              __ptr[local_48] = '@';
              bVar16 = false;
              local_48 = local_48 + 1;
            }
            if (bVar16) {
              bVar16 = false;
            }
            else {
              kVar1 = hdr->h->keys[uVar13];
              pcVar5 = __ptr;
              if (__size < local_48 + 2) {
                uVar4 = local_48 + 1 >> 1 | local_48 + 1;
                uVar4 = uVar4 >> 2 | uVar4;
                uVar4 = uVar4 >> 4 | uVar4;
                uVar4 = uVar4 >> 8 | uVar4;
                __size = (uVar4 >> 0x10 | uVar4) + 1;
                pcVar5 = (char *)realloc(__ptr,__size);
                if (pcVar5 != (char *)0x0) goto LAB_00134469;
                bVar16 = true;
              }
              else {
LAB_00134469:
                __ptr = pcVar5;
                __ptr[local_48] = (char)(kVar1 >> 8);
                __ptr[local_48 + 1] = (char)kVar1;
                bVar16 = false;
                local_48 = local_48 + 2;
              }
              if (bVar16) {
                bVar16 = false;
              }
              else {
                pSVar10 = (SAM_hdr_tag *)&local_50->tag;
                do {
                  pSVar10 = pSVar10->next;
                  uVar4 = local_48 + 1;
                  if (pSVar10 == (SAM_hdr_tag *)0x0) {
                    pcVar5 = __ptr;
                    if (uVar4 < __size) {
LAB_0013463a:
                      __ptr = pcVar5;
                      (__ptr + local_48)[0] = '\n';
                      (__ptr + local_48)[1] = '\0';
                      bVar16 = false;
                      local_48 = uVar4;
                    }
                    else {
                      uVar6 = uVar4 >> 1 | uVar4;
                      uVar6 = uVar6 >> 2 | uVar6;
                      uVar6 = uVar6 >> 4 | uVar6;
                      uVar6 = uVar6 >> 8 | uVar6;
                      __size = (uVar6 >> 0x10 | uVar6) + 1;
                      pcVar5 = (char *)realloc(__ptr,__size);
                      if (pcVar5 != (char *)0x0) goto LAB_0013463a;
                      bVar16 = true;
                    }
                    bVar16 = !bVar16;
                    if (bVar16) {
                      local_50 = local_50->next;
                    }
                    goto LAB_00134662;
                  }
                  pcVar5 = __ptr;
                  if (__size < uVar4) {
                    uVar6 = local_48 >> 1 | local_48;
                    uVar6 = uVar6 >> 2 | uVar6;
                    uVar6 = uVar6 >> 4 | uVar6;
                    uVar6 = uVar6 >> 8 | uVar6;
                    __size = (uVar6 >> 0x10 | uVar6) + 1;
                    pcVar5 = (char *)realloc(__ptr,__size);
                    if (pcVar5 != (char *)0x0) goto LAB_001344f0;
                    bVar16 = true;
                  }
                  else {
LAB_001344f0:
                    __ptr = pcVar5;
                    __ptr[local_48] = '\t';
                    bVar16 = false;
                    local_48 = uVar4;
                  }
                  if (bVar16) break;
                  pcVar5 = pSVar10->str;
                  iVar15 = pSVar10->len;
                  uVar4 = local_48 + (long)iVar15;
                  pcVar7 = __ptr;
                  if (__size < uVar4) {
                    uVar6 = uVar4 - 1 >> 1 | uVar4 - 1;
                    uVar6 = uVar6 >> 2 | uVar6;
                    uVar6 = uVar6 >> 4 | uVar6;
                    uVar6 = uVar6 >> 8 | uVar6;
                    __size = (uVar6 >> 0x10 | uVar6) + 1;
                    pcVar7 = (char *)realloc(__ptr,__size);
                    if (pcVar7 != (char *)0x0) goto LAB_00134564;
                    bVar16 = true;
                  }
                  else {
LAB_00134564:
                    memcpy(pcVar7 + local_48,pcVar5,(long)iVar15);
                    bVar16 = iVar15 == -1;
                    __ptr = pcVar7;
                    local_48 = uVar4;
                  }
                } while (!bVar16);
                bVar16 = false;
              }
            }
LAB_00134662:
            if (!bVar16) {
              iVar15 = 1;
              goto LAB_0013468b;
            }
          } while (local_50 != pSVar2);
          iVar15 = 0;
        }
LAB_0013468b:
        if ((iVar15 != 7) && (iVar15 != 0)) goto LAB_0013482d;
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
        pkVar3 = hdr->h;
      } while (uVar12 != pkVar3->n_buckets);
    }
    pcVar5 = (hdr->text).s;
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    (hdr->text).l = local_48;
    (hdr->text).m = __size;
    (hdr->text).s = __ptr;
    iVar15 = 0;
  }
  else {
    pSVar2 = pkVar3->vals[uVar13];
    __ptr = (char *)malloc(8);
    if (__ptr != (char *)0x0) {
      builtin_strncpy(__ptr,"@HD",4);
      local_48 = 3;
      pSVar10 = (SAM_hdr_tag *)&pSVar2->tag;
      __size = 8;
      do {
        pSVar10 = pSVar10->next;
        uVar13 = local_48 + 1;
        if (pSVar10 == (SAM_hdr_tag *)0x0) {
          pcVar5 = __ptr;
          if (uVar13 < __size) {
LAB_00134890:
            __ptr = pcVar5;
            (__ptr + local_48)[0] = '\n';
            (__ptr + local_48)[1] = '\0';
            bVar16 = true;
            local_48 = uVar13;
          }
          else {
            uVar4 = uVar13 >> 1 | uVar13;
            uVar4 = uVar4 >> 2 | uVar4;
            uVar4 = uVar4 >> 4 | uVar4;
            uVar4 = uVar4 >> 8 | uVar4;
            __size = (uVar4 >> 0x10 | uVar4) + 1;
            pcVar5 = (char *)realloc(__ptr,__size);
            if (pcVar5 != (char *)0x0) goto LAB_00134890;
            bVar16 = false;
          }
          if (!bVar16) {
            return -1;
          }
          goto LAB_00134330;
        }
        pcVar5 = __ptr;
        if (__size < uVar13) {
          uVar4 = local_48 >> 1 | local_48;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          __size = (uVar4 >> 0x10 | uVar4) + 1;
          pcVar5 = (char *)realloc(__ptr,__size);
          if (pcVar5 != (char *)0x0) goto LAB_00134777;
          bVar16 = true;
        }
        else {
LAB_00134777:
          __ptr = pcVar5;
          __ptr[local_48] = '\t';
          bVar16 = false;
          local_48 = uVar13;
        }
        if (bVar16) break;
        pcVar5 = pSVar10->str;
        iVar15 = pSVar10->len;
        uVar13 = local_48 + (long)iVar15;
        pcVar7 = __ptr;
        if (__size < uVar13) {
          uVar4 = uVar13 - 1 >> 1 | uVar13 - 1;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          __size = (uVar4 >> 0x10 | uVar4) + 1;
          pcVar7 = (char *)realloc(__ptr,__size);
          if (pcVar7 != (char *)0x0) goto LAB_001347ef;
          bVar16 = true;
        }
        else {
LAB_001347ef:
          memcpy(pcVar7 + local_48,pcVar5,(long)iVar15);
          bVar16 = iVar15 == -1;
          local_48 = uVar13;
          __ptr = pcVar7;
        }
      } while (!bVar16);
    }
LAB_0013482d:
    iVar15 = -1;
  }
  return iVar15;
}

Assistant:

int sam_hdr_rebuild(SAM_hdr *hdr) {
    /* Order: HD then others */
    kstring_t ks = KS_INITIALIZER;
    khint_t k;


    k = kh_get(sam_hdr, hdr->h, K("HD"));
    if (k != kh_end(hdr->h)) {
	SAM_hdr_type *ty = kh_val(hdr->h, k);
	SAM_hdr_tag *tag;
	if (EOF == kputs("@HD", &ks))
	    return -1;
	for (tag = ty->tag; tag; tag = tag->next) {
	    if (EOF == kputc_('\t', &ks))
		return -1;
	    if (EOF == kputsn_(tag->str, tag->len, &ks))
		return -1;
	}
	if (EOF == kputc('\n', &ks))
	    return -1;
    }

    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;

	if (!kh_exist(hdr->h, k))
	    continue;

	if (kh_key(hdr->h, k) == K("HD"))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	do {
	    SAM_hdr_tag *tag;
	    char c[2];

	    if (EOF == kputc_('@', &ks))
		return -1;
	    c[0] = kh_key(hdr->h, k)>>8;
	    c[1] = kh_key(hdr->h, k)&0xff;
	    if (EOF == kputsn_(c, 2, &ks))
		return -1;
	    for (tag = t1->tag; tag; tag=tag->next) {
		if (EOF == kputc_('\t', &ks))
		    return -1;
		if (EOF == kputsn_(tag->str, tag->len, &ks))
		    return -1;
	    }
	    if (EOF == kputc('\n', &ks))
		return -1;
	    t1 = t1->next;
	} while (t1 != t2);
    }

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    hdr->text = ks;

    return 0;
}